

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O1

roaring64_bitmap_t * roaring64_bitmap_of(size_t n_args,...)

{
  char in_AL;
  roaring64_bitmap_t *r;
  void **ppvVar1;
  uint uVar2;
  undefined8 in_RCX;
  ulong uVar3;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  roaring64_bulk_context_t context;
  void **local_f0;
  roaring64_bulk_context_t local_d8;
  void *local_c8 [4];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined4 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Da;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_c8[1] = (void *)in_RSI;
  local_c8[2] = (void *)in_RDX;
  local_c8[3] = (void *)in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  r = (roaring64_bitmap_t *)roaring_malloc(0x10);
  (r->art).root = (art_node_t *)0x0;
  r->flags = '\0';
  local_d8.high_bytes[0] = '\0';
  local_d8.high_bytes[1] = '\0';
  local_d8.high_bytes[2] = '\0';
  local_d8.high_bytes[3] = '\0';
  local_d8.high_bytes[4] = '\0';
  local_d8.high_bytes[5] = '\0';
  local_d8._6_2_ = 0;
  local_d8.leaf = (roaring64_leaf_t *)0x0;
  local_f0 = &ap[0].overflow_arg_area;
  uVar2 = 8;
  if (n_args != 0) {
    do {
      uVar3 = (ulong)uVar2;
      if (uVar3 < 0x29) {
        uVar2 = uVar2 + 8;
        ppvVar1 = (void **)((long)local_c8 + uVar3);
      }
      else {
        ppvVar1 = local_f0;
        local_f0 = local_f0 + 1;
      }
      roaring64_bitmap_add_bulk(r,&local_d8,(uint64_t)*ppvVar1);
      n_args = n_args - 1;
    } while (n_args != 0);
  }
  return r;
}

Assistant:

roaring64_bitmap_t *roaring64_bitmap_of(size_t n_args, ...) {
    roaring64_bitmap_t *r = roaring64_bitmap_create();
    roaring64_bulk_context_t context = {0};
    va_list ap;
    va_start(ap, n_args);
    for (size_t i = 0; i < n_args; i++) {
        uint64_t val = va_arg(ap, uint64_t);
        roaring64_bitmap_add_bulk(r, &context, val);
    }
    va_end(ap);
    return r;
}